

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall Lowerer::LowerFrameDisplayCheck(Lowerer *this,Instr *instr)

{
  uint uVar1;
  Instr *insertBeforeInstr;
  Instr *pIVar2;
  RegOpnd *baseOpnd;
  code *pcVar3;
  OpndKind OVar4;
  bool bVar5;
  Opnd *this_00;
  undefined4 *puVar6;
  Type *pTVar7;
  IndirOpnd *pIVar8;
  RegOpnd *baseOpnd_00;
  IntConstOpnd *pIVar9;
  Instr *instr_00;
  ulong uVar10;
  Lowerer *pLVar11;
  NodeBase *pNVar12;
  undefined1 local_68 [8];
  Iterator __iter;
  LabelInstr *local_50;
  LabelInstr *local_48;
  
  insertBeforeInstr = instr->m_next;
  pIVar2 = instr->m_prev;
  this_00 = IR::Instr::UnlinkSrc2(instr);
  OVar4 = IR::Opnd::GetKind(this_00);
  if (OVar4 != OpndKindAddr) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
    if (!bVar5) goto LAB_005c7bd4;
    *puVar6 = 0;
  }
  pNVar12 = (NodeBase *)this_00[2]._vptr_Opnd;
  baseOpnd = (RegOpnd *)instr->m_dst;
  OVar4 = IR::Opnd::GetKind((Opnd *)baseOpnd);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar5) {
LAB_005c7bd4:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  __iter.current = pNVar12;
  if (*(int *)&pNVar12[1].next + 1U < 3) {
    local_50 = (LabelInstr *)0x0;
    local_48 = (LabelInstr *)0x0;
  }
  else {
    local_48 = IR::LabelInstr::New(Label,this->m_func,true);
    local_50 = IR::LabelInstr::New(Label,this->m_func,false);
    pIVar8 = IR::IndirOpnd::New(baseOpnd,2,TyUint16,this->m_func,true);
    pNVar12 = __iter.current;
    pLVar11 = (Lowerer *)(ulong)(*(int *)&__iter.current[1].next - 1);
    pIVar9 = IR::IntConstOpnd::New((IntConstType)pLVar11,TyUint16,this->m_func,false);
    InsertCompareBranch(pLVar11,&pIVar8->super_Opnd,&pIVar9->super_Opnd,BrLe_A,true,local_48,
                        insertBeforeInstr,false);
  }
  if ((pNVar12->next != (Type)0x0) && (*(int *)&pNVar12->next[1].next != 0)) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar10 = 0;
    do {
      local_68 = (undefined1  [8])(pNVar12->next[2].next + uVar10 * 2);
      __iter.list = (SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount> *)local_68;
      while( true ) {
        if (__iter.list == (SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount> *)0x0
           ) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar5) goto LAB_005c7bd4;
          *puVar6 = 0;
        }
        __iter.list = (SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount> *)
                      ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        if ((undefined1  [8])__iter.list == local_68) break;
        pTVar7 = SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)local_68);
        uVar1 = pTVar7->element;
        if (uVar1 - 3 < 0xfffffffc) {
          if (local_48 == (LabelInstr *)0x0) {
            local_48 = IR::LabelInstr::New(Label,this->m_func,true);
            local_50 = IR::LabelInstr::New(Label,this->m_func,false);
          }
          pIVar8 = IR::IndirOpnd::New(baseOpnd,pTVar7->value << 3,TyVar,this->m_func,true);
          baseOpnd_00 = IR::RegOpnd::New(TyVar,this->m_func);
          InsertMove(&baseOpnd_00->super_Opnd,&pIVar8->super_Opnd,insertBeforeInstr,true);
          pIVar8 = IR::IndirOpnd::New(baseOpnd_00,0,TyVar,this->m_func,true);
          pLVar11 = (Lowerer *)(ulong)(uVar1 - 2);
          pIVar9 = IR::IntConstOpnd::New((IntConstType)pLVar11,TyUint32,this->m_func,false);
          InsertCompareBranch(pLVar11,&pIVar8->super_Opnd,&pIVar9->super_Opnd,BrLe_A,true,local_48,
                              insertBeforeInstr,false);
          pNVar12 = __iter.current;
        }
      }
      uVar10 = uVar10 + 1;
      __iter.list = (SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount> *)0x0;
    } while (uVar10 < *(uint *)&pNVar12->next[1].next);
  }
  if (local_48 != (LabelInstr *)0x0) {
    InsertBranch(Br,false,local_50,insertBeforeInstr);
    IR::Instr::InsertBefore(insertBeforeInstr,&local_48->super_Instr);
    instr_00 = IR::Instr::New(Call,this->m_func);
    IR::Instr::InsertBefore(insertBeforeInstr,instr_00);
    LowererMD::ChangeToHelperCall
              (&this->m_lowererMD,instr_00,HelperOp_FatalInternalError,(LabelInstr *)0x0,(Opnd *)0x0
               ,(PropertySymOpnd *)0x0,false);
    IR::Instr::InsertBefore(insertBeforeInstr,&local_50->super_Instr);
  }
  LowererMD::ChangeToAssign(instr);
  return pIVar2;
}

Assistant:

IR::Instr *
Lowerer::LowerFrameDisplayCheck(IR::Instr * instr)
{
    IR::Instr *instrPrev = instr->m_prev;
    IR::Instr *insertInstr = instr->m_next;
    IR::AddrOpnd *addrOpnd = instr->UnlinkSrc2()->AsAddrOpnd();
    FrameDisplayCheckRecord *record = (FrameDisplayCheckRecord*)addrOpnd->m_address;

    IR::LabelInstr *errorLabel = nullptr;
    IR::LabelInstr *continueLabel = nullptr;
    IR::RegOpnd *envOpnd = instr->GetDst()->AsRegOpnd();
    uint32 frameDisplayOffset = Js::FrameDisplay::GetOffsetOfScopes()/sizeof(Js::Var);

    if (record->slotId != (uint32)-1 && record->slotId > frameDisplayOffset)
    {
        // Check that the frame display has enough scopes in it to satisfy the code.
        errorLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
        continueLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);

        IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(envOpnd,
                                                       Js::FrameDisplay::GetOffsetOfLength(),
                                                       TyUint16, m_func, true);

        IR::IntConstOpnd *slotIdOpnd = IR::IntConstOpnd::New(record->slotId - frameDisplayOffset, TyUint16, m_func);
        InsertCompareBranch(indirOpnd, slotIdOpnd, Js::OpCode::BrLe_A, true, errorLabel, insertInstr);
    }

    if (record->table)
    {
        // Check the size of each of the slot arrays in the scope chain.
        FOREACH_HASHTABLE_ENTRY(uint32, bucket, record->table)
        {
            uint32 slotId = bucket.element;
            if (slotId != (uint32)-1 && slotId > Js::ScopeSlots::FirstSlotIndex)
            {
                if (errorLabel == nullptr)
                {
                    errorLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
                    continueLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);
                }

                IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(envOpnd,
                                                               bucket.value * sizeof(Js::Var),
                                                               TyVar, m_func, true);
                IR::RegOpnd * slotArrayOpnd = IR::RegOpnd::New(TyVar, m_func);
                InsertMove(slotArrayOpnd, indirOpnd, insertInstr);

                indirOpnd = IR::IndirOpnd::New(slotArrayOpnd,
                                               Js::ScopeSlots::EncodedSlotCountSlotIndex * sizeof(Js::Var),
                                               TyVar, m_func, true);

                IR::IntConstOpnd * slotIdOpnd = IR::IntConstOpnd::New(slotId - Js::ScopeSlots::FirstSlotIndex,
                                                                      TyUint32, m_func);
                InsertCompareBranch(indirOpnd, slotIdOpnd, Js::OpCode::BrLe_A, true, errorLabel, insertInstr);
            }
        }
        NEXT_HASHTABLE_ENTRY;
    }

    if (errorLabel)
    {
        InsertBranch(Js::OpCode::Br, continueLabel, insertInstr);

        insertInstr->InsertBefore(errorLabel);
        IR::Instr * instrHelper = IR::Instr::New(Js::OpCode::Call, m_func);
        insertInstr->InsertBefore(instrHelper);
        m_lowererMD.ChangeToHelperCall(instrHelper, IR::HelperOp_FatalInternalError);
        insertInstr->InsertBefore(continueLabel);
    }

    m_lowererMD.ChangeToAssign(instr);

    return instrPrev;
}